

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMLSParserImpl::docPI(DOMLSParserImpl *this,XMLCh *target,XMLCh *data)

{
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *this_00;
  DOMNode *key;
  uint uVar1;
  ValueHashTableBucketElem<bool> *pVVar2;
  XMLSize_t hashVal;
  XMLSize_t local_20;
  
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (this_00 = this->fFilterDelayedTextNodes,
     this_00 != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    key = (this->super_AbstractDOMParser).fCurrentNode;
    for (pVVar2 = this_00->fBucketList[(ulong)key % this_00->fHashModulus];
        pVVar2 != (ValueHashTableBucketElem<bool> *)0x0; pVVar2 = pVVar2->fNext) {
      if ((DOMNode *)pVVar2->fKey == key) {
        ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeBucketElem(this_00,key,&local_20);
        applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
        break;
      }
    }
  }
  AbstractDOMParser::docPI(&this->super_AbstractDOMParser,target,data);
  if (this->fFilter != (DOMLSParserFilter *)0x0) {
    uVar1 = (*this->fFilter->_vptr_DOMLSParserFilter[4])();
    if ((uVar1 & 0x40) != 0) {
      applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::docPI(const XMLCh* const    target
                          , const XMLCh* const    data)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::docPI(target, data);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_PROCESSING_INSTRUCTION)
            applyFilter(fCurrentNode);
    }
}